

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

bool __thiscall ON_wString::Insert(ON_wString *this,int index,wchar_t *wsz)

{
  size_t array_capacity;
  uint uVar1;
  bool bVar2;
  size_t sVar3;
  ON_Internal_Empty_wString *pOVar4;
  wchar_t *__src;
  
  if (wsz == (wchar_t *)0x0 || index < 0) {
    return false;
  }
  pOVar4 = (ON_Internal_Empty_wString *)(this->m_s + -3);
  if (this->m_s == (wchar_t *)0x0) {
    pOVar4 = &empty_wstring;
  }
  uVar1 = (pOVar4->header).string_length;
  if (uVar1 < (uint)index) {
    bVar2 = false;
  }
  else {
    sVar3 = wcslen(wsz);
    array_capacity = sVar3 + (long)(int)uVar1;
    ReserveArray(this,array_capacity);
    __src = this->m_s + (uint)index;
    memmove(__src + sVar3,__src,((long)(int)uVar1 - (ulong)(uint)index) * 4 + 4);
    memmove(__src,wsz,sVar3 << 2);
    pOVar4 = (ON_Internal_Empty_wString *)(this->m_s + -3);
    if (this->m_s == (wchar_t *)0x0) {
      pOVar4 = &empty_wstring;
    }
    (pOVar4->header).string_length = (int)array_capacity;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool ON_wString::Insert(int index, const wchar_t* wsz)
{
  if ((index < 0) || (wsz == nullptr))
    return false;

  const auto length = size_t(Header()->string_length);
  if (index > length)
    return false;

  const auto insert_count = wcslen(wsz);

  const auto new_length = length + insert_count;
  ReserveArray(new_length);

  auto* p = m_s + index;
  const auto move_bytes = (length - index + 1) * sizeof(wchar_t);
  memmove(p + insert_count, p, move_bytes);
  memmove(p, wsz, insert_count * sizeof(wchar_t));

  Header()->string_length = int(new_length);

  return true;
}